

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddQuadFilled(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImU32 col)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (0xffffff < col) {
    iVar5 = (this->_Path).Size;
    iVar4 = (this->_Path).Capacity;
    if (iVar5 == iVar4) {
      iVar5 = iVar5 + 1;
      if (iVar4 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar4 / 2 + iVar4;
      }
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
      if (iVar4 < iVar5) {
        pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar2;
        (this->_Path).Capacity = iVar5;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *a;
    iVar4 = (this->_Path).Size;
    iVar3 = (this->_Path).Capacity;
    iVar5 = iVar4 + 1;
    (this->_Path).Size = iVar5;
    if (iVar5 == iVar3) {
      iVar4 = iVar4 + 2;
      if (iVar3 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar3 / 2 + iVar3;
      }
      if (iVar4 < iVar5) {
        iVar4 = iVar5;
      }
      if (iVar3 < iVar4) {
        pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar2;
        (this->_Path).Capacity = iVar4;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *b;
    iVar4 = (this->_Path).Size;
    iVar3 = (this->_Path).Capacity;
    iVar5 = iVar4 + 1;
    (this->_Path).Size = iVar5;
    if (iVar5 == iVar3) {
      iVar4 = iVar4 + 2;
      if (iVar3 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar3 / 2 + iVar3;
      }
      if (iVar4 < iVar5) {
        iVar4 = iVar5;
      }
      if (iVar3 < iVar4) {
        pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar2;
        (this->_Path).Capacity = iVar4;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *c;
    iVar4 = (this->_Path).Size;
    iVar3 = (this->_Path).Capacity;
    iVar5 = iVar4 + 1;
    (this->_Path).Size = iVar5;
    if (iVar5 == iVar3) {
      iVar4 = iVar4 + 2;
      if (iVar3 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar3 / 2 + iVar3;
      }
      if (iVar4 < iVar5) {
        iVar4 = iVar5;
      }
      if (iVar3 < iVar4) {
        pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar4 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar2;
        (this->_Path).Capacity = iVar4;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *d;
    iVar5 = (this->_Path).Size + 1;
    (this->_Path).Size = iVar5;
    AddConvexPolyFilled(this,(this->_Path).Data,iVar5,col);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddQuadFilled(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathFillConvex(col);
}